

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O2

void rt_map4cols_c(int sx,int yl,int yh)

{
  int iVar1;
  lighttable_t *plVar2;
  uint uVar3;
  BYTE *pBVar4;
  long lVar5;
  byte *pbVar6;
  long lVar7;
  
  plVar2 = dc_colormap;
  iVar1 = dc_pitch;
  uVar3 = yh - yl;
  if (-1 < (int)uVar3) {
    pBVar4 = dc_destorg + (long)sx + (long)ylookup[yl];
    pbVar6 = dc_temp + yl * 4;
    lVar7 = (long)dc_pitch;
    if ((uVar3 & 1) == 0) {
      *pBVar4 = dc_colormap[*pbVar6];
      pBVar4[1] = plVar2[pbVar6[1]];
      pBVar4[2] = plVar2[pbVar6[2]];
      pBVar4[3] = plVar2[pbVar6[3]];
      pbVar6 = pbVar6 + 4;
      pBVar4 = pBVar4 + lVar7;
    }
    if (yh != yl) {
      lVar5 = 0;
      do {
        *pBVar4 = plVar2[pbVar6[lVar5 * 8]];
        pBVar4[1] = plVar2[pbVar6[lVar5 * 8 + 1]];
        pBVar4[2] = plVar2[pbVar6[lVar5 * 8 + 2]];
        pBVar4[3] = plVar2[pbVar6[lVar5 * 8 + 3]];
        pBVar4[lVar7] = plVar2[pbVar6[lVar5 * 8 + 4]];
        pBVar4[iVar1 + 1] = plVar2[pbVar6[lVar5 * 8 + 5]];
        pBVar4[iVar1 + 2] = plVar2[pbVar6[lVar5 * 8 + 6]];
        pBVar4[iVar1 + 3] = plVar2[pbVar6[lVar5 * 8 + 7]];
        pBVar4 = pBVar4 + iVar1 * 2;
        lVar5 = lVar5 + 1;
      } while (uVar3 + 1 >> 1 != (uint)lVar5);
    }
  }
  return;
}

Assistant:

void rt_map4cols_c (int sx, int yl, int yh)
{
	BYTE *colormap;
	BYTE *source;
	BYTE *dest;
	int count;
	int pitch;

	count = yh-yl;
	if (count < 0)
		return;
	count++;

	colormap = dc_colormap;
	dest = ylookup[yl] + sx + dc_destorg;
	source = &dc_temp[yl*4];
	pitch = dc_pitch;
	
	if (count & 1) {
		dest[0] = colormap[source[0]];
		dest[1] = colormap[source[1]];
		dest[2] = colormap[source[2]];
		dest[3] = colormap[source[3]];
		source += 4;
		dest += pitch;
	}
	if (!(count >>= 1))
		return;

	do {
		dest[0] = colormap[source[0]];
		dest[1] = colormap[source[1]];
		dest[2] = colormap[source[2]];
		dest[3] = colormap[source[3]];
		dest[pitch] = colormap[source[4]];
		dest[pitch+1] = colormap[source[5]];
		dest[pitch+2] = colormap[source[6]];
		dest[pitch+3] = colormap[source[7]];
		source += 8;
		dest += pitch*2;
	} while (--count);
}